

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errorHandle.cpp
# Opt level: O1

void __thiscall blc::error::exception::exception(exception *this,string *msg)

{
  pointer pcVar1;
  ostringstream oss;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__exception_0011a9d8;
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_msg,pcVar1,pcVar1 + msg->_M_string_length);
  (this->_file)._M_dataplus._M_p = (pointer)&(this->_file).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_file,"ND","");
  (this->_func)._M_dataplus._M_p = (pointer)&(this->_func).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_func,"ND","");
  this->_line = -1;
  this->_time = -1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error : ",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

blc::error::exception::exception(std::string msg) : _msg(msg), _file("ND"), _func("ND"), _line(-1), _time(-1) {
	std::ostringstream oss;

	oss << "Error : " << msg;
	this->_msg = oss.str();
}